

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

void Omega_h::binary::swap_bytes<long>(long *ptr)

{
  ulong uVar1;
  long *ptr_local;
  uint64_t *p2;
  
  uVar1 = *ptr;
  *ptr = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  return;
}

Assistant:

void swap_bytes(T& ptr) {
  SwapBytes<T>::swap(&ptr);
}